

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O2

bool __thiscall SQInstance::Set(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  SQObjectPtr idx;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = SQTable::Get(this->_class->_members,key,&local_28);
  if ((bVar1) && ((local_28.super_SQObject._unVal._0_4_ >> 0x19 & 1) != 0)) {
    bVar1 = true;
    SQObjectPtr::operator=
              ((SQObjectPtr *)
               ((long)&this->_values[0].super_SQObject._type +
               (ulong)((local_28.super_SQObject._unVal._0_4_ & 0xffffff) << 4)),val);
  }
  else {
    bVar1 = false;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar1;
}

Assistant:

bool Set(const SQObjectPtr &key,const SQObjectPtr &val) {
        SQObjectPtr idx;
        if(_class->_members->Get(key,idx) && _isfield(idx)) {
            _values[_member_idx(idx)] = val;
            return true;
        }
        return false;
    }